

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

char * CVodeGetLinReturnFlagName(long flag)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  pcVar1 = (char *)malloc(0x1e);
  switch(flag) {
  case 0:
    builtin_strncpy(pcVar1 + 5,"SUCCESS",8);
    uVar2 = 0x4355535f534c5643;
    break;
  default:
    if (flag != -0x66) {
      if (flag == -0x65) {
        builtin_strncpy(pcVar1,"CVLS_NO_ADJ",0xc);
        return pcVar1;
      }
      builtin_strncpy(pcVar1,"NONE",5);
      return pcVar1;
    }
    uVar3._0_1_ = '_';
    uVar3._1_1_ = 'L';
    uVar3._2_1_ = 'M';
    uVar3._3_1_ = 'E';
    uVar4._0_1_ = 'M';
    uVar4._1_1_ = 'B';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'N';
    uVar5._0_1_ = 'U';
    uVar5._1_1_ = 'L';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = '\0';
LAB_001261f5:
    pcVar1[0] = 'C';
    pcVar1[1] = 'V';
    pcVar1[2] = 'L';
    pcVar1[3] = 'S';
    *(undefined4 *)(pcVar1 + 4) = uVar3;
    *(undefined4 *)(pcVar1 + 8) = uVar4;
    *(undefined4 *)(pcVar1 + 0xc) = uVar5;
    return pcVar1;
  case -9:
    uVar3._0_1_ = '_';
    uVar3._1_1_ = 'S';
    uVar3._2_1_ = 'U';
    uVar3._3_1_ = 'N';
    uVar4._0_1_ = 'L';
    uVar4._1_1_ = 'S';
    uVar4._2_1_ = '_';
    uVar4._3_1_ = 'F';
    uVar5._0_1_ = 'A';
    uVar5._1_1_ = 'I';
    uVar5._2_1_ = 'L';
    uVar5._3_1_ = '\0';
    goto LAB_001261f5;
  case -8:
    builtin_strncpy(pcVar1,"CVLS_SUNMAT_FAIL",0x11);
    return pcVar1;
  case -7:
    builtin_strncpy(pcVar1,"CVLS_JACFUNC_RECVR",0x13);
    return pcVar1;
  case -6:
    builtin_strncpy(pcVar1,"CVLS_JACFUNC_UNRECVR",0x15);
    return pcVar1;
  case -5:
    builtin_strncpy(pcVar1 + 7,"EM_NULL",8);
    uVar2 = 0x454d505f534c5643;
    break;
  case -4:
    uVar2 = 0x4c4941465f4d45;
    goto LAB_00126287;
  case -3:
    builtin_strncpy(pcVar1 + 7,"L_INPUT",8);
    uVar2 = 0x4c4c495f534c5643;
    break;
  case -2:
    builtin_strncpy(pcVar1 + 7,"EM_NULL",8);
    uVar2 = 0x454d4c5f534c5643;
    break;
  case -1:
    uVar2 = 0x4c4c554e5f4d45;
LAB_00126287:
    *(undefined8 *)(pcVar1 + 6) = uVar2;
    uVar2 = 0x4d454d5f534c5643;
  }
  *(undefined8 *)pcVar1 = uVar2;
  return pcVar1;
}

Assistant:

char* CVodeGetLinReturnFlagName(long int flag)
{
  char* name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case CVLS_SUCCESS: sprintf(name, "CVLS_SUCCESS"); break;
  case CVLS_MEM_NULL: sprintf(name, "CVLS_MEM_NULL"); break;
  case CVLS_LMEM_NULL: sprintf(name, "CVLS_LMEM_NULL"); break;
  case CVLS_ILL_INPUT: sprintf(name, "CVLS_ILL_INPUT"); break;
  case CVLS_MEM_FAIL: sprintf(name, "CVLS_MEM_FAIL"); break;
  case CVLS_PMEM_NULL: sprintf(name, "CVLS_PMEM_NULL"); break;
  case CVLS_JACFUNC_UNRECVR: sprintf(name, "CVLS_JACFUNC_UNRECVR"); break;
  case CVLS_JACFUNC_RECVR: sprintf(name, "CVLS_JACFUNC_RECVR"); break;
  case CVLS_SUNMAT_FAIL: sprintf(name, "CVLS_SUNMAT_FAIL"); break;
  case CVLS_SUNLS_FAIL: sprintf(name, "CVLS_SUNLS_FAIL"); break;
  case CVLS_NO_ADJ: sprintf(name, "CVLS_NO_ADJ"); break;
  case CVLS_LMEMB_NULL: sprintf(name, "CVLS_LMEMB_NULL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}